

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O3

void __thiscall QProcessEnvironment::insert(QProcessEnvironment *this,QString *name,QString *value)

{
  QProcessEnvironmentPrivate *pQVar1;
  long in_FS_OFFSET;
  QProcEnvValue local_78;
  Key local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QSharedDataPointer<QProcessEnvironmentPrivate>::detach(&this->d);
  QSharedDataPointer<QProcessEnvironmentPrivate>::detach(&this->d);
  pQVar1 = (this->d).d.ptr;
  QSharedDataPointer<QProcessEnvironmentPrivate>::detach(&this->d);
  QProcessEnvironmentPrivate::prepareName(&local_40,(this->d).d.ptr,name);
  QSharedDataPointer<QProcessEnvironmentPrivate>::detach(&this->d);
  local_78.byteValue.d.d = (Data *)0x0;
  local_78.byteValue.d.ptr = (char *)0x0;
  local_78.byteValue.d.size = 0;
  local_78.stringValue.d.d = (value->d).d;
  local_78.stringValue.d.ptr = (value->d).ptr;
  local_78.stringValue.d.size = (value->d).size;
  if (&(local_78.stringValue.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_78.stringValue.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_78.stringValue.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QMap<QByteArray,_QProcEnvValue>::insert(&pQVar1->vars,&local_40,&local_78);
  if (&(local_78.stringValue.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.stringValue.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.stringValue.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         + -1;
    UNLOCK();
    if (((local_78.stringValue.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
        == 0) {
      QArrayData::deallocate(&(local_78.stringValue.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_78.byteValue.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.byteValue.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.byteValue.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_78.byteValue.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_78.byteValue.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QProcessEnvironment::insert(const QString &name, const QString &value)
{
    // our re-impl of detach() detaches from null
    d.detach(); // detach before prepareName()
    d->vars.insert(d->prepareName(name), d->prepareValue(value));
}